

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_write_add_filter_lzma(archive *_a)

{
  int iVar1;
  archive_write_filter *f_00;
  int magic_test;
  int r;
  archive_write_filter *f;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_lzma");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    f_00 = __archive_write_allocate_filter(_a);
    _a_local._4_4_ = common_setup(f_00);
    if (_a_local._4_4_ == 0) {
      f_00->code = 5;
      f_00->name = "lzma";
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_add_filter_lzma(struct archive *_a)
{
	struct archive_write_filter *f;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_lzma");
	f = __archive_write_allocate_filter(_a);
	r = common_setup(f);
	if (r == ARCHIVE_OK) {
		f->code = ARCHIVE_FILTER_LZMA;
		f->name = "lzma";
	}
	return (r);
}